

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall ParserTestTwoChdirs::~ParserTestTwoChdirs(ParserTestTwoChdirs *this)

{
  ParserTest::~ParserTest(&this->super_ParserTest);
  operator_delete(this,0x248);
  return;
}

Assistant:

TEST_F(ParserTest, TwoChdirs) {
  fs_.MakeDir("test-a");
  fs_.Create("test-a/a.ninja",
    "rule cat\n"
    "  command = cat $in > $out\n"
    "build out2: cat in1\n"
    "build out1: cat in2\n"
    "build final: cat out1\n"
    "default final\n");

  fs_.MakeDir("test-b");
  fs_.Create("test-b/b.ninja",
    "rule cat\n"
    "  command = cat $in > $out\n"
    "build out2: cat in1\n"
    "build out3: cat in2\n"
    "build final: cat out3\n"
    "default final\n");

  // Verify that duplicate 'default final' lines in subninjas do not conflict.
  // Verify that 'default final' in a chdir is ignored.
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"subninja a.ninja\n"
"    chdir = test-a\n"
"\n"
"rule pipe-through-test-a\n"
"    command = $in | test-a/final > $out\n"
"\n"
"build foo: pipe-through-test-a | test-b/final\n"
"default foo\n"
"\n"
"subninja b.ninja\n"
"    chdir = test-b\n"
  ));
  EXPECT_EQ("/", VerifyCwd(fs_));  // Verify cwd was restored

  // Verify edge command includes correct 'cd test-a'
  Edge* edge = GetNode("test-a/final")->in_edge();
#if _WIN32
  EXPECT_EQ("cmd /c cd \"test-a/\" && cat out1 > final", edge->EvaluateCommand());
#else
  EXPECT_EQ("cd \"test-a/\" && cat out1 > final", edge->EvaluateCommand());
#endif

  // Verify edge command includes correct 'cd test-b'
  edge = GetNode("test-b/final")->in_edge();
#if _WIN32
  EXPECT_EQ("cmd /c cd \"test-b/\" && cat out3 > final", edge->EvaluateCommand());
#else
  EXPECT_EQ("cd \"test-b/\" && cat out3 > final", edge->EvaluateCommand());
#endif
}